

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_embedded_oneof(CTcEmbedBuilder *b,int *eos,CTcEmbedLevel *parent)

{
  CTcEmbedTokenList *this;
  int iVar1;
  CTPNList *this_00;
  CTcEmbedTokenList *tl_00;
  CTcPrsNode *pCVar2;
  CTcEmbedLevel *in_RDX;
  size_t i;
  char *attrs;
  CTcPrsNode *ele;
  CTPNList *lst;
  CTcEmbedLevel level;
  CTcEmbedTokenList *tl;
  CTcEmbedLevel *in_stack_00000088;
  int *in_stack_00000090;
  CTcEmbedBuilder *in_stack_00000098;
  ulong local_68;
  char *local_60;
  CTPNListBase *in_stack_ffffffffffffffb0;
  CTcEmbedTokenList *in_stack_ffffffffffffffc8;
  CTcEmbedLevel *in_stack_ffffffffffffffd0;
  
  this = G_prs->embed_toks_;
  CTcEmbedLevel::CTcEmbedLevel((CTcEmbedLevel *)&stack0xffffffffffffffc8,2,in_RDX);
  this_00 = (CTPNList *)CTcPrsAllocObj::operator_new(0x256004);
  *(undefined8 *)&(this_00->super_CTPNListBase).const_val_.field_0x20 = 0;
  *(undefined8 *)&(this_00->super_CTPNListBase).field_0x48 = 0;
  (this_00->super_CTPNListBase).const_val_.val_.floatval_.len_ = 0;
  *(undefined8 *)((long)&(this_00->super_CTPNListBase).const_val_.val_ + 0x10) = 0;
  *(undefined8 *)&(this_00->super_CTPNListBase).const_val_ = 0;
  (this_00->super_CTPNListBase).const_val_.val_.intval_ = 0;
  (this_00->super_CTPNListBase).head_ = (CTPNListEle *)0x0;
  (this_00->super_CTPNListBase).tail_ = (CTPNListEle *)0x0;
  (this_00->super_CTPNListBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_CTPNListBase).cnt_ = 0;
  CTPNList::CTPNList(this_00);
  do {
    tl_00 = (CTcEmbedTokenList *)
            parse_embedding_list(in_stack_00000098,in_stack_00000090,in_stack_00000088);
    if (tl_00 == (CTcEmbedTokenList *)0x0) {
      return (CTcPrsNode *)0x0;
    }
    CTPNListBase::add_element(in_stack_ffffffffffffffb0,(CTcPrsNode *)tl_00);
    CTcEmbedTokenList::reset(this);
    capture_embedded((CTcEmbedBuilder *)in_stack_ffffffffffffffb0,tl_00);
    iVar1 = CTcEmbedTokenList::match(in_stack_ffffffffffffffc8,(char *)this_00);
  } while ((iVar1 != 0) ||
          (iVar1 = CTcEmbedTokenList::match(in_stack_ffffffffffffffc8,(char *)this_00), iVar1 != 0))
  ;
  local_60 = (char *)0x0;
  local_68 = 0;
  do {
    if (0xb < local_68) {
LAB_00256151:
      if (local_60 == (char *)0x0) {
        CTcEmbedTokenList::unget
                  ((CTcEmbedTokenList *)in_stack_ffffffffffffffb0,(int)((ulong)tl_00 >> 0x20),
                   (int)tl_00);
      }
      pCVar2 = create_oneof_node((CTcEmbedBuilder *)in_stack_ffffffffffffffd0,
                                 (CTPNList *)in_stack_ffffffffffffffc8,(char *)this_00);
      return pCVar2;
    }
    iVar1 = CTcEmbedTokenList::match(in_stack_ffffffffffffffc8,(char *)this_00);
    if (iVar1 != 0) {
      local_60 = one_of_list[local_68].attr;
      goto LAB_00256151;
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_embedded_oneof(
    CTcEmbedBuilder *b, int &eos, CTcEmbedLevel *parent)
{
    /* get the embedding token list capturer */
    CTcEmbedTokenList *tl = G_prs->embed_toks_;

    /* set up our stack level */
    CTcEmbedLevel level(CTcEmbedLevel::OneOf, parent);

    /* create a list node to hold the items */
    CTPNList *lst = new CTPNList();

    /* keep going until we get to the end of the list */
    for (;;)
    {
        /* parse the next string or embedded expression */
        CTcPrsNode *ele = parse_embedding_list(b, eos, &level);
        if (ele == 0)
            return 0;

        /* add this element to the list */
        lst->add_element(ele);

        /* capture the ending token list */
        tl->reset();
        capture_embedded(b, tl);

        /* if we're not at an OR, this is the end of the list */
        if (!tl->match("or") && !tl->match("||"))
            break;
    }

    /* 
     *   Search for a match to one of our endings.  If we don't find one, use
     *   "purely at random" as the default. 
     */
    const char *attrs = 0;
    for (size_t i = 0 ; i < countof(one_of_list) ; ++i)
    {
        /* check for a match */
        if (tl->match(one_of_list[i].endph))
        {
            /* got it - set this attribute and stop searching */
            attrs = one_of_list[i].attr;
            break;
        }
    }

    /* 
     *   if we didn't find a match for the ending tokens, we must have the
     *   ending for an enclosing structure; put the tokens back for the
     *   enclosing structure to parse, and use "purely at random" as the
     *   default 
     */
    if (attrs == 0)
    {
        tl->unget();
        attrs = "rand";
    }

    /* create the one-of list */
    return create_oneof_node(b, lst, attrs);
}